

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_rc_Ptr.h
# Opt level: O3

int __thiscall axl::rc::Ptr<void>::copy(Ptr<void> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int32_t *piVar1;
  int iVar2;
  uint uVar3;
  FreeFunc *in_RAX;
  RefCount *pRVar4;
  
  iVar2 = (int)in_RAX;
  this->m_p = dst;
  pRVar4 = this->m_refCount;
  if (pRVar4 != (RefCount *)src) {
    if (src != (EVP_PKEY_CTX *)0x0) {
      LOCK();
      *(int *)(src + 0x10) = *(int *)(src + 0x10) + 1;
      UNLOCK();
      pRVar4 = this->m_refCount;
    }
    if (pRVar4 != (RefCount *)0x0) {
      LOCK();
      piVar1 = &pRVar4->m_refCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        uVar3 = (**pRVar4->_vptr_RefCount)(pRVar4);
        in_RAX = (FreeFunc *)(ulong)uVar3;
        LOCK();
        piVar1 = &pRVar4->m_weakRefCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (in_RAX = pRVar4->m_freeFunc, in_RAX != (FreeFunc *)0x0)) {
          in_RAX = (FreeFunc *)(*in_RAX)(pRVar4);
        }
      }
    }
    iVar2 = (int)in_RAX;
    this->m_refCount = (RefCount *)src;
  }
  return iVar2;
}

Assistant:

void
	copy(
		T* p,
		RefCount* refCount
	) {
		m_p = p;

		if (m_refCount == refCount)
			return;

		if (refCount)
			refCount->addRef();

		if (m_refCount)
			m_refCount->release();

		m_refCount = refCount;
	}